

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

void CombinationKeygenRecurse<Blob<224>,block16>
               (block16 *key,int len,int maxlen,block16 *blocks,int blockcount,pfHash hash,
               vector<Blob<224>,_std::allocator<Blob<224>_>_> *hashes)

{
  undefined8 uVar1;
  long lVar2;
  Blob<224> h;
  Blob<224> local_4c;
  
  if (len != maxlen) {
    for (lVar2 = 0; (ulong)(uint)(~(blockcount >> 0x1f) & blockcount) << 4 != lVar2;
        lVar2 = lVar2 + 0x10) {
      uVar1 = *(undefined8 *)(blocks->c + lVar2 + 8);
      *(undefined8 *)key[len].c = *(undefined8 *)(blocks->c + lVar2);
      *(undefined8 *)(key[len].c + 8) = uVar1;
      Blob<224>::Blob(&local_4c);
      (*hash)(key,(len + 1) * 0x10,0,&local_4c);
      std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::push_back(hashes,&local_4c);
      CombinationKeygenRecurse<Blob<224>,block16>(key,len + 1,maxlen,blocks,blockcount,hash,hashes);
    }
  }
  return;
}

Assistant:

void CombinationKeygenRecurse ( blocktype * key, int len, int maxlen,
                  blocktype * blocks, int blockcount,
                  pfHash hash, std::vector<hashtype> & hashes )
{
  if(len == maxlen) return;  // end recursion

  for(int i = 0; i < blockcount; i++)
  {
    key[len] = blocks[i];

    //if(len == maxlen-1)
    {
      hashtype h;
      hash(key, (len+1) * sizeof(blocktype), 0, &h);
      hashes.push_back(h);
    }

    //else
    {
      CombinationKeygenRecurse(key,len+1,maxlen,blocks,blockcount,hash,hashes);
    }
  }
}